

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# deSocket.c
# Opt level: O0

int deSocketProtocolToBsdProtocol(deSocketProtocol protocol)

{
  undefined4 local_c;
  deSocketProtocol protocol_local;
  
  if (protocol == DE_SOCKETPROTOCOL_TCP) {
    local_c = 6;
  }
  else if (protocol == DE_SOCKETPROTOCOL_UDP) {
    local_c = 0x11;
  }
  else {
    local_c = 0;
  }
  return local_c;
}

Assistant:

static int deSocketProtocolToBsdProtocol (deSocketProtocol protocol)
{
	switch (protocol)
	{
		case DE_SOCKETPROTOCOL_TCP:	return IPPROTO_TCP;
		case DE_SOCKETPROTOCOL_UDP:	return IPPROTO_UDP;
		default:
			DE_ASSERT(DE_FALSE);
			return 0;
	}
}